

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  size_t length;
  char *__s;
  char filtered_string [1024];
  char string [1024];
  char acStack_818 [1024];
  char local_418 [1032];
  
  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets(local_418,0x400,_stdin);
  length = filter_letters(local_418,acStack_818);
  _Var1 = is_palindrome(acStack_818,length);
  __s = "It isn\'t a palindrome.";
  if (_Var1) {
    __s = "It is indeed a palindrome.";
  }
  puts(__s);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char string[STR_LEN];
  char filtered_string[STR_LEN];

  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets(string, STR_LEN, stdin);

  size_t length = filter_letters(string, filtered_string);

  if (is_palindrome(filtered_string, length)) {
    printf("It is indeed a palindrome.\n");
  } else {
    printf("It isn't a palindrome.\n");
  }

  return 0;
}